

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoAtomicStore<unsigned_long,unsigned_short>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  bool bVar1;
  pointer puVar2;
  Store *this_00;
  Memory *pMVar3;
  ulong uVar4;
  RunResult RVar5;
  ulong uVar6;
  Value VVar7;
  Value VVar8;
  RefPtr<wabt::interp::Memory> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_80,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar7 = Pop(this);
  pMVar3 = local_80.obj_;
  bVar1 = ((local_80.obj_)->type_).limits.is_64;
  VVar8 = Pop(this);
  uVar4 = (ulong)VVar8.field_0.i32_;
  if (bVar1 != false) {
    uVar4 = VVar8.field_0.i64_;
  }
  puVar2 = (pMVar3->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar6 = (long)(pMVar3->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if ((((uVar6 < 2) || (uVar6 < uVar4)) || (uVar6 < instr.field_2.imm_u32x2.snd)) ||
     ((uVar4 = uVar4 + instr.field_2.imm_u32x2.snd, (uVar4 & 1) != 0 || (uVar6 < uVar4 + 2)))) {
    this_00 = this->store_;
    StringPrintf_abi_cxx11_(&local_68,"invalid atomic access at %lu+%u");
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    RVar5 = Trap;
  }
  else {
    *(short *)(puVar2 + uVar4) = VVar7.field_0._0_2_;
    RVar5 = Ok;
  }
  if (local_80.obj_ != (Memory *)0x0) {
    Store::DeleteRoot(local_80.store_,local_80.root_index_);
  }
  return RVar5;
}

Assistant:

RunResult Thread::DoAtomicStore(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V val = static_cast<V>(Pop<T>());
  u64 offset = PopPtr(memory);
  TRAP_IF(Failed(memory->AtomicStore(offset, instr.imm_u32x2.snd, val)),
          StringPrintf("invalid atomic access at %" PRIaddress "+%u", offset,
                       instr.imm_u32x2.snd));
  return RunResult::Ok;
}